

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

void cimg_library::CImgDisplay::_render_resize<unsigned_short,unsigned_short>
               (unsigned_short *ptrs,uint ws,uint hs,unsigned_short *ptrd,uint wd,uint hd)

{
  unsigned_long uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  unsigned_long *puVar7;
  unsigned_short *puVar8;
  ulong uVar9;
  ulongT old;
  ulong uVar10;
  ulongT old_1;
  CImg<unsigned_long> off_y;
  CImg<unsigned_long> off_x;
  unsigned_long local_78;
  CImg<unsigned_long> local_70;
  CImg<unsigned_long> local_50;
  
  CImg<unsigned_long>::CImg(&local_50,wd,1,1,1);
  CImg<unsigned_long>::CImg(&local_70,hd + 1,1,1,1);
  if (wd == ws) {
    local_78 = 1;
    CImg<unsigned_long>::fill(&local_50,&local_78);
  }
  else if (wd != 0) {
    uVar9 = 0;
    uVar4 = (ulong)ws;
    uVar10 = 0;
    do {
      uVar2 = uVar4 / wd;
      local_50._data[uVar9] = uVar2 - uVar10;
      uVar9 = uVar9 + 1;
      uVar4 = uVar4 + ws;
      uVar10 = uVar2;
    } while (wd != uVar9);
  }
  if (hd == hs) {
    local_78 = (unsigned_long)ws;
    CImg<unsigned_long>::fill(&local_70,&local_78);
  }
  else {
    puVar7 = local_70._data;
    if (hd != 0) {
      uVar4 = (ulong)hs;
      uVar10 = (ulong)hd;
      uVar9 = 0;
      do {
        uVar2 = uVar4 / hd;
        *puVar7 = (uVar2 - uVar9) * (ulong)ws;
        puVar7 = puVar7 + 1;
        uVar4 = uVar4 + hs;
        uVar10 = uVar10 - 1;
        uVar9 = uVar2;
      } while (uVar10 != 0);
    }
    *puVar7 = 0;
  }
  if (hd != 0) {
    uVar4 = (ulong)wd;
    uVar6 = 0;
    puVar7 = local_70._data;
    do {
      if (wd != 0) {
        lVar3 = 0;
        lVar5 = 0;
        puVar8 = ptrs;
        do {
          ptrd[lVar5] = *puVar8;
          puVar8 = puVar8 + local_50._data[lVar5];
          lVar5 = lVar5 + 1;
          lVar3 = lVar3 + -2;
        } while (wd != (uint)lVar5);
        ptrd = (unsigned_short *)((long)ptrd - lVar3);
      }
      uVar1 = *puVar7;
      while( true ) {
        uVar6 = uVar6 + 1;
        puVar7 = puVar7 + 1;
        if ((uVar1 != 0) || (hd <= uVar6)) break;
        memcpy(ptrd,ptrd + -uVar4,uVar4 * 2);
        uVar1 = *puVar7;
        ptrd = ptrd + uVar4;
      }
      ptrs = ptrs + uVar1;
    } while (uVar6 < hd);
  }
  if ((local_70._is_shared == false) && (local_70._data != (unsigned_long *)0x0)) {
    operator_delete__(local_70._data);
  }
  if ((local_50._is_shared == false) && (local_50._data != (unsigned_long *)0x0)) {
    operator_delete__(local_50._data);
  }
  return;
}

Assistant:

static void _render_resize(const T *ptrs, const unsigned int ws, const unsigned int hs,
                               t *ptrd, const unsigned int wd, const unsigned int hd) {
      typedef typename cimg::last<T,cimg_ulong>::type ulongT;
      const ulongT one = (ulongT)1;
      CImg<ulongT> off_x(wd), off_y(hd + 1);
      if (wd==ws) off_x.fill(1);
      else {
        ulongT *poff_x = off_x._data, curr = 0;
        for (unsigned int x = 0; x<wd; ++x) {
          const ulongT old = curr;
          curr = (x + one)*ws/wd;
          *(poff_x++) = curr - old;
        }
      }
      if (hd==hs) off_y.fill(ws);
      else {
        ulongT *poff_y = off_y._data, curr = 0;
        for (unsigned int y = 0; y<hd; ++y) {
          const ulongT old = curr;
          curr = (y + one)*hs/hd;
          *(poff_y++) = ws*(curr - old);
        }
        *poff_y = 0;
      }
      ulongT *poff_y = off_y._data;
      for (unsigned int y = 0; y<hd; ) {
        const T *ptr = ptrs;
        ulongT *poff_x = off_x._data;
        for (unsigned int x = 0; x<wd; ++x) { *(ptrd++) = *ptr; ptr+=*(poff_x++); }
        ++y;
        ulongT dy = *(poff_y++);
        for ( ; !dy && y<hd; std::memcpy(ptrd,ptrd - wd,sizeof(t)*wd), ++y, ptrd+=wd, dy = *(poff_y++)) {}
        ptrs+=dy;
      }
    }